

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreConstruct.cpp
# Opt level: O2

expression * mathCore::binary_or(expression *a,expression *b)

{
  expression *this;
  expression *b_local;
  expression *a_local;
  
  b_local = b;
  a_local = a;
  this = (expression *)operator_new(0x38);
  expression::expression(this);
  this->FLAGS = 0x20;
  std::
  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
  ::_M_insert_equal<expression*const&>
            ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              *)&this->contents,&a_local);
  std::
  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
  ::_M_insert_equal<expression*const&>
            ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              *)&this->contents,&b_local);
  return this;
}

Assistant:

expression* mathCore::binary_or(expression* a, expression* b) {
	expression* exp = new expression;
	exp->FLAGS = F_OR;
	exp->contents.insert(a);
	exp->contents.insert(b);
	return exp;
}